

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

duration<long,_boost::ratio<1L,_1L>_>
hungarian_algorithm::
solve<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
          (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
           *cost_function,unsigned_long num_rows,unsigned_long num_cols,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
          greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  duration<long,_boost::ratio<1L,_1L>_> dVar1;
  duration<long,_boost::ratio<1L,_1L>_> local_140;
  undefined1 local_138 [8];
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  solver;
  greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map_local;
  unsigned_long num_cols_local;
  unsigned_long num_rows_local;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_function_local;
  
  solver.cost_matrix_.
  super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)cost_comparator;
  boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::duration(&local_140);
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::HungarianSolver((HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                     *)local_138,num_rows,num_cols,cost_comparator,&local_140);
  HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ::
  solve<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
            ((HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
              *)local_138,cost_function);
  dVar1 = HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
          ::
          getAssignment<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::greater<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
                      *)local_138,cost_function,assignment_map);
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::~HungarianSolver((HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                      *)local_138);
  return (duration<long,_boost::ratio<1L,_1L>_>)dVar1.rep_;
}

Assistant:

Cost solve(const CostFunction& cost_function, const Size num_rows, const Size num_cols, AssignmentMap& assignment_map,
           const CostComparator& cost_comparator)
{
  HungarianSolver<Cost, Size, CostComparator> solver(num_rows, num_cols, cost_comparator, Cost());
  solver.solve(cost_function);
  return solver.getAssignment(cost_function, assignment_map);
}